

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprAnalyzeAggList(NameContext *pNC,ExprList *pList)

{
  int iVar1;
  int iVar2;
  ExprList_item *pEVar3;
  Walker local_60;
  
  if ((pList != (ExprList *)0x0) && (iVar1 = pList->nExpr, 0 < iVar1)) {
    pEVar3 = pList->a;
    iVar2 = 0;
    do {
      local_60.xExprCallback = analyzeAggregate;
      local_60.xSelectCallback = analyzeAggregatesInSelect;
      local_60.xSelectCallback2 = analyzeAggregatesInSelectEnd;
      local_60.walkerDepth = 0;
      local_60.pParse = (Parse *)0x0;
      if (pEVar3->pExpr != (Expr *)0x0) {
        local_60.u.pNC = pNC;
        walkExpr(&local_60,pEVar3->pExpr);
        iVar1 = pList->nExpr;
      }
      iVar2 = iVar2 + 1;
      pEVar3 = pEVar3 + 1;
    } while (iVar2 < iVar1);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAnalyzeAggList(NameContext *pNC, ExprList *pList){
  struct ExprList_item *pItem;
  int i;
  if( pList ){
    for(pItem=pList->a, i=0; i<pList->nExpr; i++, pItem++){
      sqlite3ExprAnalyzeAggregates(pNC, pItem->pExpr);
    }
  }
}